

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# checkqueue_tests.cpp
# Opt level: O1

void __thiscall
checkqueue_tests::test_CheckQueue_UniqueCheck::test_method(test_CheckQueue_UniqueCheck *this)

{
  ulong uVar1;
  __uniq_ptr_data<CCheckQueue<UniqueCheck>,_std::default_delete<CCheckQueue<UniqueCheck>_>,_true,_true>
  pqueueIn;
  uint64_t uVar2;
  size_type sVar3;
  pointer pFVar4;
  ulong unaff_RBP;
  iterator in_R8;
  iterator pvVar5;
  iterator in_R9;
  iterator pvVar6;
  ulong uVar7;
  long in_FS_OFFSET;
  bool bVar8;
  bool bVar9;
  const_string file;
  const_string file_00;
  const_string msg;
  const_string msg_00;
  check_type cVar10;
  char *local_158;
  char *local_150;
  undefined1 *local_148;
  undefined1 *local_140;
  char *local_138;
  char *local_130;
  size_type local_128;
  undefined1 local_120 [16];
  undefined1 *local_110;
  char *local_108;
  undefined1 *local_100;
  undefined1 *local_f8;
  char *local_f0;
  char *local_e8;
  size_t total;
  size_t COUNT;
  __single_object queue;
  size_t *local_c8;
  size_type *local_c0;
  vector<FakeCheckCheckCompletion,_std::allocator<FakeCheckCheckCompletion>_> vChecks;
  char *local_90;
  char *local_88;
  assertion_result local_80;
  UniqueLock<AnnotatedMixin<std::mutex>_> criticalblock13;
  CCheckQueueControl<UniqueCheck> control;
  shared_count sStack_48;
  size_t **local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pqueueIn.
  super___uniq_ptr_impl<CCheckQueue<UniqueCheck>,_std::default_delete<CCheckQueue<UniqueCheck>_>_>.
  _M_t.
  super__Tuple_impl<0UL,_CCheckQueue<UniqueCheck>_*,_std::default_delete<CCheckQueue<UniqueCheck>_>_>
  .super__Head_base<0UL,_CCheckQueue<UniqueCheck>_*,_false>._M_head_impl =
       (__uniq_ptr_impl<CCheckQueue<UniqueCheck>,_std::default_delete<CCheckQueue<UniqueCheck>_>_>)
       operator_new(0x100);
  CCheckQueue<UniqueCheck>::CCheckQueue
            ((CCheckQueue<UniqueCheck> *)
             pqueueIn.
             super___uniq_ptr_impl<CCheckQueue<UniqueCheck>,_std::default_delete<CCheckQueue<UniqueCheck>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_CCheckQueue<UniqueCheck>_*,_std::default_delete<CCheckQueue<UniqueCheck>_>_>
             .super__Head_base<0UL,_CCheckQueue<UniqueCheck>_*,_false>._M_head_impl,0x80,3);
  COUNT = 100000;
  total = 100000;
  queue._M_t.
  super___uniq_ptr_impl<CCheckQueue<UniqueCheck>,_std::default_delete<CCheckQueue<UniqueCheck>_>_>.
  _M_t.
  super__Tuple_impl<0UL,_CCheckQueue<UniqueCheck>_*,_std::default_delete<CCheckQueue<UniqueCheck>_>_>
  .super__Head_base<0UL,_CCheckQueue<UniqueCheck>_*,_false>._M_head_impl =
       (__uniq_ptr_data<CCheckQueue<UniqueCheck>,_std::default_delete<CCheckQueue<UniqueCheck>_>,_true,_true>
        )(__uniq_ptr_data<CCheckQueue<UniqueCheck>,_std::default_delete<CCheckQueue<UniqueCheck>_>,_true,_true>
          )pqueueIn.
           super___uniq_ptr_impl<CCheckQueue<UniqueCheck>,_std::default_delete<CCheckQueue<UniqueCheck>_>_>
           ._M_t.
           super__Tuple_impl<0UL,_CCheckQueue<UniqueCheck>_*,_std::default_delete<CCheckQueue<UniqueCheck>_>_>
           .super__Head_base<0UL,_CCheckQueue<UniqueCheck>_*,_false>._M_head_impl;
  CCheckQueueControl<UniqueCheck>::CCheckQueueControl
            (&control,(CCheckQueue<FakeCheckCheckCompletion> *)
                      pqueueIn.
                      super___uniq_ptr_impl<CCheckQueue<UniqueCheck>,_std::default_delete<CCheckQueue<UniqueCheck>_>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_CCheckQueue<UniqueCheck>_*,_std::default_delete<CCheckQueue<UniqueCheck>_>_>
                      .super__Head_base<0UL,_CCheckQueue<UniqueCheck>_*,_false>._M_head_impl);
  if (total != 0) {
    do {
      do {
        uVar2 = RandomMixin<FastRandomContext>::randbits
                          (&(this->super_BOOST_AUTO_TEST_CASE_FIXTURE).
                            super_NoLockLoggingTestingSetup.super_TestingSetup.
                            super_ChainTestingSetup.super_BasicTestingSetup.m_rng.
                            super_RandomMixin<FastRandomContext>,4);
        uVar1 = unaff_RBP;
        if (9 >= uVar2) {
          uVar1 = uVar2;
        }
        unaff_RBP = uVar1 & 0xffffffff;
      } while (9 < uVar2);
      vChecks.
      super__Vector_base<FakeCheckCheckCompletion,_std::allocator<FakeCheckCheckCompletion>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      vChecks.
      super__Vector_base<FakeCheckCheckCompletion,_std::allocator<FakeCheckCheckCompletion>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      vChecks.
      super__Vector_base<FakeCheckCheckCompletion,_std::allocator<FakeCheckCheckCompletion>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      if (total != 0 && (int)uVar1 != 0) {
        uVar7 = 1;
        do {
          total = total - 1;
          if (vChecks.
              super__Vector_base<FakeCheckCheckCompletion,_std::allocator<FakeCheckCheckCompletion>_>
              ._M_impl.super__Vector_impl_data._M_finish ==
              vChecks.
              super__Vector_base<FakeCheckCheckCompletion,_std::allocator<FakeCheckCheckCompletion>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage) {
            std::vector<UniqueCheck,std::allocator<UniqueCheck>>::_M_realloc_insert<unsigned_long&>
                      ((vector<UniqueCheck,std::allocator<UniqueCheck>> *)&vChecks,
                       (iterator)
                       vChecks.
                       super__Vector_base<FakeCheckCheckCompletion,_std::allocator<FakeCheckCheckCompletion>_>
                       ._M_impl.super__Vector_impl_data._M_finish,&total);
          }
          else {
            *(size_t *)
             vChecks.
             super__Vector_base<FakeCheckCheckCompletion,_std::allocator<FakeCheckCheckCompletion>_>
             ._M_impl.super__Vector_impl_data._M_finish = total;
            vChecks.
            super__Vector_base<FakeCheckCheckCompletion,_std::allocator<FakeCheckCheckCompletion>_>.
            _M_impl.super__Vector_impl_data._M_finish =
                 vChecks.
                 super__Vector_base<FakeCheckCheckCompletion,_std::allocator<FakeCheckCheckCompletion>_>
                 ._M_impl.super__Vector_impl_data._M_finish + 8;
          }
        } while ((uVar7 < (ulong)(long)(int)uVar1) && (uVar7 = uVar7 + 1, total != 0));
      }
      if (control.pqueue != (CCheckQueue<FakeCheckCheckCompletion> *)0x0) {
        CCheckQueue<UniqueCheck>::Add((CCheckQueue<UniqueCheck> *)control.pqueue,&vChecks);
      }
      if (vChecks.
          super__Vector_base<FakeCheckCheckCompletion,_std::allocator<FakeCheckCheckCompletion>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(vChecks.
                        super__Vector_base<FakeCheckCheckCompletion,_std::allocator<FakeCheckCheckCompletion>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)vChecks.
                              super__Vector_base<FakeCheckCheckCompletion,_std::allocator<FakeCheckCheckCompletion>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)vChecks.
                              super__Vector_base<FakeCheckCheckCompletion,_std::allocator<FakeCheckCheckCompletion>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
    } while (total != 0);
  }
  CCheckQueueControl<UniqueCheck>::~CCheckQueueControl(&control);
  criticalblock13.super_unique_lock._M_device = &UniqueCheck::m.super_mutex;
  criticalblock13.super_unique_lock._M_owns = false;
  std::unique_lock<std::mutex>::lock(&criticalblock13.super_unique_lock);
  local_f0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/checkqueue_tests.cpp"
  ;
  local_e8 = "";
  local_100 = &boost::unit_test::basic_cstring<char_const>::null;
  local_f8 = &boost::unit_test::basic_cstring<char_const>::null;
  file.m_end = (iterator)0x11d;
  file.m_begin = (iterator)&local_f0;
  msg.m_end = in_R9;
  msg.m_begin = in_R8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_100,msg);
  local_120._8_8_ = local_120._8_8_ & 0xffffffffffffff00;
  local_120._0_8_ = &PTR__lazy_ostream_013abb30;
  local_110 = boost::unit_test::lazy_ostream::inst;
  local_108 = "";
  local_c0 = &local_128;
  local_c8 = &COUNT;
  local_80.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(UniqueCheck::results._M_h._M_element_count == COUNT);
  local_128 = UniqueCheck::results._M_h._M_element_count;
  local_80.m_message.px = (element_type *)0x0;
  local_80.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_90 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/checkqueue_tests.cpp"
  ;
  local_88 = "";
  vChecks.super__Vector_base<FakeCheckCheckCompletion,_std::allocator<FakeCheckCheckCompletion>_>.
  _M_impl.super__Vector_impl_data._M_finish =
       (pointer)((ulong)vChecks.
                        super__Vector_base<FakeCheckCheckCompletion,_std::allocator<FakeCheckCheckCompletion>_>
                        ._M_impl.super__Vector_impl_data._M_finish & 0xffffffffffffff00);
  vChecks.super__Vector_base<FakeCheckCheckCompletion,_std::allocator<FakeCheckCheckCompletion>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)&PTR__lazy_ostream_013abb70;
  vChecks.super__Vector_base<FakeCheckCheckCompletion,_std::allocator<FakeCheckCheckCompletion>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)boost::unit_test::lazy_ostream::inst;
  local_40 = &local_c8;
  control._8_8_ = control._8_8_ & 0xffffffffffffff00;
  control.pqueue = (CCheckQueue<FakeCheckCheckCompletion> *)&PTR__lazy_ostream_013abb70;
  sStack_48.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  pvVar5 = (iterator)0x2;
  pvVar6 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            (&local_80,(lazy_ostream *)local_120,2,2,REQUIRE,0xe6bcc5,(size_t)&local_90,0x11d,
             &vChecks,"COUNT",&control);
  boost::detail::shared_count::~shared_count(&local_80.m_message.pn);
  vChecks.super__Vector_base<FakeCheckCheckCompletion,_std::allocator<FakeCheckCheckCompletion>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  if (COUNT == 0) {
    bVar8 = true;
LAB_00316a65:
    local_138 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/checkqueue_tests.cpp"
    ;
    local_130 = "";
    local_148 = &boost::unit_test::basic_cstring<char_const>::null;
    local_140 = &boost::unit_test::basic_cstring<char_const>::null;
    _cVar10 = 0x316a9c;
    file_00.m_end = (iterator)0x121;
    file_00.m_begin = (iterator)&local_138;
    msg_00.m_end = pvVar6;
    msg_00.m_begin = pvVar5;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_148,
               msg_00);
    control.pqueue = (CCheckQueue<FakeCheckCheckCompletion> *)CONCAT71(control.pqueue._1_7_,bVar8);
    control.fDone = false;
    control._9_7_ = 0;
    sStack_48.pi_ = (sp_counted_base *)0x0;
    local_120._0_8_ = "r";
    local_120._8_8_ = "";
    vChecks.super__Vector_base<FakeCheckCheckCompletion,_std::allocator<FakeCheckCheckCompletion>_>.
    _M_impl.super__Vector_impl_data._M_finish =
         (pointer)((ulong)vChecks.
                          super__Vector_base<FakeCheckCheckCompletion,_std::allocator<FakeCheckCheckCompletion>_>
                          ._M_impl.super__Vector_impl_data._M_finish & 0xffffffffffffff00);
    vChecks.super__Vector_base<FakeCheckCheckCompletion,_std::allocator<FakeCheckCheckCompletion>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)&PTR__lazy_ostream_013abc70;
    vChecks.super__Vector_base<FakeCheckCheckCompletion,_std::allocator<FakeCheckCheckCompletion>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage =
         (pointer)boost::unit_test::lazy_ostream::inst;
    local_158 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/checkqueue_tests.cpp"
    ;
    local_150 = "";
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)&control,(lazy_ostream *)&vChecks,2,0,WARN,_cVar10,
               (size_t)&local_158,0x121);
    boost::detail::shared_count::~shared_count(&sStack_48);
    std::unique_lock<std::mutex>::~unique_lock(&criticalblock13.super_unique_lock);
    std::unique_ptr<CCheckQueue<UniqueCheck>,_std::default_delete<CCheckQueue<UniqueCheck>_>_>::
    ~unique_ptr(&queue);
    if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
      __stack_chk_fail();
    }
    return;
  }
  do {
    sVar3 = std::
            _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_false>_>
            ::count(&UniqueCheck::results._M_h,(key_type *)&vChecks);
    bVar8 = sVar3 == 1;
    pFVar4 = vChecks.
             super__Vector_base<FakeCheckCheckCompletion,_std::allocator<FakeCheckCheckCompletion>_>
             ._M_impl.super__Vector_impl_data._M_start;
    do {
      vChecks.
      super__Vector_base<FakeCheckCheckCompletion,_std::allocator<FakeCheckCheckCompletion>_>.
      _M_impl.super__Vector_impl_data._M_start = pFVar4 + 1;
      if (COUNT <= vChecks.
                   super__Vector_base<FakeCheckCheckCompletion,_std::allocator<FakeCheckCheckCompletion>_>
                   ._M_impl.super__Vector_impl_data._M_start) {
        vChecks.
        super__Vector_base<FakeCheckCheckCompletion,_std::allocator<FakeCheckCheckCompletion>_>.
        _M_impl.super__Vector_impl_data._M_start = pFVar4 + 1;
        goto LAB_00316a65;
      }
      bVar9 = bVar8 == false;
      bVar8 = false;
      pFVar4 = vChecks.
               super__Vector_base<FakeCheckCheckCompletion,_std::allocator<FakeCheckCheckCompletion>_>
               ._M_impl.super__Vector_impl_data._M_start;
    } while (bVar9);
  } while( true );
}

Assistant:

BOOST_AUTO_TEST_CASE(test_CheckQueue_UniqueCheck)
{
    auto queue = std::make_unique<Unique_Queue>(QUEUE_BATCH_SIZE, SCRIPT_CHECK_THREADS);
    size_t COUNT = 100000;
    size_t total = COUNT;
    {
        CCheckQueueControl<UniqueCheck> control(queue.get());
        while (total) {
            size_t r = m_rng.randrange(10);
            std::vector<UniqueCheck> vChecks;
            for (size_t k = 0; k < r && total; k++)
                vChecks.emplace_back(--total);
            control.Add(std::move(vChecks));
        }
    }
    {
        LOCK(UniqueCheck::m);
        bool r = true;
        BOOST_REQUIRE_EQUAL(UniqueCheck::results.size(), COUNT);
        for (size_t i = 0; i < COUNT; ++i) {
            r = r && UniqueCheck::results.count(i) == 1;
        }
        BOOST_REQUIRE(r);
    }
}